

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,char_const*,fmt::v8::detail::digit_grouping<char8_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,char *significand,
          int significand_size,int integral_size,char8_t decimal_point,
          digit_grouping<char8_t> *grouping)

{
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar1;
  basic_string_view<char8_t> digits;
  undefined **local_240;
  undefined1 *local_238;
  long lStack_230;
  ulong local_228;
  undefined1 local_220 [504];
  
  if ((grouping->sep_).thousands_sep == '\0') {
    bVar1 = write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>
                      (out,significand,significand_size,integral_size,decimal_point);
    return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar1.container;
  }
  lStack_230 = 0;
  local_240 = &PTR_grow_001b29f0;
  local_228 = 500;
  local_238 = local_220;
  write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>
            ((buffer<char8_t> *)&local_240,significand,significand_size,integral_size,decimal_point)
  ;
  if (-1 < integral_size) {
    digits.size_._0_4_ = integral_size;
    digits.data_ = local_238;
    digits.size_._4_4_ = 0;
    digit_grouping<char8_t>::
    apply<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>(grouping,out,digits);
    bVar1 = copy_str_noinline<char8_t,char8_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                      (local_238 + (uint)integral_size,local_238 + lStack_230,out);
    if (local_238 != local_220) {
      operator_delete(local_238,local_228);
    }
    return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar1.container;
  }
  fmt::v8::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
             ,0x195,"negative value");
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}